

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_flat_file.c
# Opt level: O0

void test_flat_file_sort_get_many_nonexist(planck_unit_test_t *tc)

{
  undefined4 local_ac;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined1 local_78 [8];
  ion_flat_file_t flat_file;
  planck_unit_test_t *tc_local;
  
  flat_file.num_in_buffer = (size_t)tc;
  ftest_setup_sorted(tc,(ion_flat_file_t *)local_78);
  local_7c = 0x11;
  local_80 = 0x11;
  ftest_insert((planck_unit_test_t *)flat_file.num_in_buffer,(ion_flat_file_t *)local_78,&local_7c,
               &local_80,'\0',1,'\x01');
  local_84 = 0x2d;
  local_88 = 0x11;
  ftest_insert((planck_unit_test_t *)flat_file.num_in_buffer,(ion_flat_file_t *)local_78,&local_84,
               &local_88,'\0',1,'\x01');
  local_8c = 0x3f;
  local_90 = 0x11;
  ftest_insert((planck_unit_test_t *)flat_file.num_in_buffer,(ion_flat_file_t *)local_78,&local_8c,
               &local_90,'\0',1,'\x01');
  local_94 = 0x40;
  local_98 = 0x11;
  ftest_insert((planck_unit_test_t *)flat_file.num_in_buffer,(ion_flat_file_t *)local_78,&local_94,
               &local_98,'\0',1,'\x01');
  local_9c = 99;
  local_a0 = 0x11;
  ftest_insert((planck_unit_test_t *)flat_file.num_in_buffer,(ion_flat_file_t *)local_78,&local_9c,
               &local_a0,'\0',1,'\x01');
  local_a4 = 0x67;
  local_a8 = 0x11;
  ftest_insert((planck_unit_test_t *)flat_file.num_in_buffer,(ion_flat_file_t *)local_78,&local_a4,
               &local_a8,'\0',1,'\x01');
  local_ac = 0x21;
  ftest_get((planck_unit_test_t *)flat_file.num_in_buffer,(ion_flat_file_t *)local_78,&local_ac,
            '\x01',(ion_value_t)0x0);
  ftest_takedown((planck_unit_test_t *)flat_file.num_in_buffer,(ion_flat_file_t *)local_78);
  return;
}

Assistant:

void
test_flat_file_sort_get_many_nonexist(
	planck_unit_test_t *tc
) {
	ion_flat_file_t flat_file;

	ftest_setup_sorted(tc, &flat_file);

	ftest_insert(tc, &flat_file, IONIZE(17, int), IONIZE(17, int), err_ok, 1, boolean_true);
	ftest_insert(tc, &flat_file, IONIZE(45, int), IONIZE(17, int), err_ok, 1, boolean_true);
	ftest_insert(tc, &flat_file, IONIZE(63, int), IONIZE(17, int), err_ok, 1, boolean_true);
	ftest_insert(tc, &flat_file, IONIZE(64, int), IONIZE(17, int), err_ok, 1, boolean_true);
	ftest_insert(tc, &flat_file, IONIZE(99, int), IONIZE(17, int), err_ok, 1, boolean_true);
	ftest_insert(tc, &flat_file, IONIZE(103, int), IONIZE(17, int), err_ok, 1, boolean_true);

	ftest_get(tc, &flat_file, IONIZE(33, int), err_item_not_found, NULL);

	ftest_takedown(tc, &flat_file);
}